

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_JoinerGetport_Test::~InterpreterTestSuite_PC_JoinerGetport_Test
          (InterpreterTestSuite_PC_JoinerGetport_Test *this)

{
  InterpreterTestSuite_PC_JoinerGetport_Test *this_local;
  
  ~InterpreterTestSuite_PC_JoinerGetport_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerGetport)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetJoinerUdpPort(_, JoinerType::kNMKP)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner getport nmkp");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}